

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mel_generalized_cepstrum_to_mel_generalized_cepstrum.cc
# Opt level: O1

bool __thiscall
sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::Run
          (MelGeneralizedCepstrumToMelGeneralizedCepstrum *this,
          vector<double,_std::allocator<double>_> *input,
          vector<double,_std::allocator<double>_> *output,Buffer *buffer)

{
  pointer pdVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  int iVar5;
  size_t __n;
  vector<double,_std::allocator<double>_> *pvVar6;
  size_type __new_size;
  pointer ppMVar7;
  bool bVar8;
  
  if (this->is_valid_ == true) {
    bVar8 = false;
    if (((buffer != (Buffer *)0x0) && (output != (vector<double,_std::allocator<double>_> *)0x0)) &&
       ((long)(input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start >> 3 == (long)this->num_input_order_ + 1)) {
      ppMVar7 = (this->modules_).
                super__Vector_base<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*,_std::allocator<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (ppMVar7 ==
          (this->modules_).
          super__Vector_base<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*,_std::allocator<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        __new_size = (long)this->num_output_order_ + 1;
        if ((long)(output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start >> 3 != __new_size) {
          std::vector<double,_std::allocator<double>_>::resize(output,__new_size);
        }
        pdVar1 = (input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        bVar8 = true;
        __n = (long)(input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)pdVar1;
        if (__n != 0) {
          memmove((output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start,pdVar1,__n);
        }
      }
      else {
        bVar8 = ppMVar7 ==
                (this->modules_).
                super__Vector_base<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*,_std::allocator<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
        if (!bVar8) {
          do {
            if (ppMVar7 !=
                (this->modules_).
                super__Vector_base<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*,_std::allocator<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              pdVar1 = (output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
              pdVar2 = (buffer->temporary_mel_generalized_cepstrum_).
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish;
              pdVar3 = (output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              pdVar4 = (output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_finish;
              (output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start =
                   (buffer->temporary_mel_generalized_cepstrum_).
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
              (output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish = pdVar2;
              (output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   (buffer->temporary_mel_generalized_cepstrum_).
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
              (buffer->temporary_mel_generalized_cepstrum_).
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start = pdVar3;
              (buffer->temporary_mel_generalized_cepstrum_).
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_finish = pdVar4;
              (buffer->temporary_mel_generalized_cepstrum_).
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage = pdVar1;
            }
            pvVar6 = &buffer->temporary_mel_generalized_cepstrum_;
            if (ppMVar7 ==
                (this->modules_).
                super__Vector_base<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*,_std::allocator<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              pvVar6 = input;
            }
            iVar5 = (*(*ppMVar7)->_vptr_ModuleInterface[3])
                              (*ppMVar7,pvVar6,output,&buffer->frequency_transform_buffer_);
            if ((char)iVar5 == '\0') {
              return bVar8;
            }
            ppMVar7 = ppMVar7 + 1;
            bVar8 = ppMVar7 ==
                    (this->modules_).
                    super__Vector_base<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*,_std::allocator<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          } while (!bVar8);
        }
      }
    }
  }
  else {
    bVar8 = false;
  }
  return bVar8;
}

Assistant:

bool MelGeneralizedCepstrumToMelGeneralizedCepstrum::Run(
    const std::vector<double>& input, std::vector<double>* output,
    MelGeneralizedCepstrumToMelGeneralizedCepstrum::Buffer* buffer) const {
  if (!is_valid_ ||
      input.size() != static_cast<std::size_t>(num_input_order_ + 1) ||
      NULL == output || NULL == buffer) {
    return false;
  }

  if (modules_.empty()) {
    if (output->size() != static_cast<std::size_t>(num_output_order_ + 1)) {
      output->resize(num_output_order_ + 1);
    }
    std::copy(input.begin(), input.end(), output->begin());
    return true;
  }

  for (std::vector<MelGeneralizedCepstrumToMelGeneralizedCepstrum::
                       ModuleInterface*>::const_iterator itr(modules_.begin());
       itr != modules_.end(); ++itr) {
    if (itr != modules_.begin()) {
      output->swap(buffer->temporary_mel_generalized_cepstrum_);
    }
    if (!(*itr)->Run((itr == modules_.begin())
                         ? input
                         : buffer->temporary_mel_generalized_cepstrum_,
                     output, &(buffer->frequency_transform_buffer_))) {
      return false;
    }
  }

  return true;
}